

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void rgb_ycc_start(j_compress_ptr cinfo)

{
  jpeg_color_converter *pjVar1;
  _func_void_j_compress_ptr *p_Var2;
  code *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  pjVar1 = cinfo->cconvert;
  p_Var2 = (_func_void_j_compress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x4000);
  pjVar1[1].start_pass = p_Var2;
  pcVar3 = p_Var2 + 0x3800;
  lVar4 = 0x8000;
  lVar5 = 0x807fff;
  lVar6 = 0;
  lVar7 = 0;
  lVar8 = 0;
  lVar9 = 0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    *(long *)(pcVar3 + -0x3800) = lVar6;
    *(long *)(pcVar3 + -0x3000) = lVar7;
    *(long *)(pcVar3 + -0x2800) = lVar4;
    *(long *)(pcVar3 + -0x2000) = lVar8;
    *(long *)(pcVar3 + -0x1800) = lVar9;
    *(long *)(pcVar3 + -0x1000) = lVar5;
    *(long *)(pcVar3 + -0x800) = lVar10;
    *(long *)pcVar3 = lVar11;
    lVar11 = lVar11 + -0x14d1;
    lVar10 = lVar10 + -0x6b2f;
    lVar9 = lVar9 + -0x54cd;
    lVar8 = lVar8 + -0x2b33;
    lVar4 = lVar4 + 0x1d2f;
    lVar7 = lVar7 + 0x9646;
    pcVar3 = pcVar3 + 8;
    lVar6 = lVar6 + 0x4c8b;
    lVar5 = lVar5 + 0x8000;
  } while (lVar11 != -0x14d100);
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_start (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  INT32 * rgb_ycc_tab;
  INT32 i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_ycc_tab = rgb_ycc_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(TABLE_SIZE * SIZEOF(INT32)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_ycc_tab[i+R_Y_OFF] = FIX(0.29900) * i;
    rgb_ycc_tab[i+G_Y_OFF] = FIX(0.58700) * i;
    rgb_ycc_tab[i+B_Y_OFF] = FIX(0.11400) * i     + ONE_HALF;
    rgb_ycc_tab[i+R_CB_OFF] = (-FIX(0.16874)) * i;
    rgb_ycc_tab[i+G_CB_OFF] = (-FIX(0.33126)) * i;
    /* We use a rounding fudge-factor of 0.5-epsilon for Cb and Cr.
     * This ensures that the maximum output will round to MAXJSAMPLE
     * not MAXJSAMPLE+1, and thus that we don't have to range-limit.
     */
    rgb_ycc_tab[i+B_CB_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
/*  B=>Cb and R=>Cr tables are the same
    rgb_ycc_tab[i+R_CR_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
*/
    rgb_ycc_tab[i+G_CR_OFF] = (-FIX(0.41869)) * i;
    rgb_ycc_tab[i+B_CR_OFF] = (-FIX(0.08131)) * i;
  }
}